

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O1

void __thiscall
GenericSection_RoundTripForPopulated_Test::TestBody(GenericSection_RoundTripForPopulated_Test *this)

{
  uchar *puVar1;
  database *export_db;
  undefined8 uVar2;
  uint generation;
  mapped_type *pmVar3;
  string *src;
  parser<pstore::exchange::import_ns::callbacks> *ppVar4;
  char *pcVar5;
  database *pdVar6;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  section_content *args_2;
  int iVar7;
  pointer *__ptr;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out;
  AssertionResult gtest_ar__1;
  section_kind kind;
  mock_mutex mutex;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  section_content imported_content;
  string exported_json;
  parser<pstore::exchange::import_ns::callbacks> parser;
  array<const_char_*,_2UL> names;
  section_content exported_content;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  string_mapping exported_names;
  ostringstream exported_names_stream;
  string_mapping imported_names;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff97c;
  AssertHelper local_678;
  database *local_670;
  section_kind local_661;
  undefined1 local_660 [8];
  undefined1 local_658 [8];
  undefined1 local_650 [16];
  pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>
  local_640;
  _List_node_base *local_628;
  bool local_620;
  pointer local_5c8;
  pointer local_5b8;
  undefined1 local_5a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_5a0;
  pointer local_598;
  AssertHelper local_590;
  undefined1 local_588 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578 [7];
  pointer local_500;
  pointer local_4f0;
  database *local_4e0;
  vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> local_4d8;
  undefined1 local_4c0 [8];
  undefined1 local_4b8 [8];
  undefined1 local_4b0 [96];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  _Alloc_hider local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  coord local_420;
  small_vector<unsigned_char,_128UL> *local_418;
  vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> local_410;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> vStack_3f8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0 [4];
  int local_368;
  error_category *local_360;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  _Alloc_hider local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  char *local_318;
  char *pcStack_310;
  char *local_308;
  not_null<pstore::database_*> local_300;
  undefined1 local_2f8 [144];
  pointer local_268;
  pointer local_258;
  uchar *local_250;
  pointer local_248;
  pointer piStack_240;
  pointer local_238;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> vStack_230;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_218;
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e0;
  ostringstream local_1a8;
  undefined1 local_158 [56];
  _List_node_base *local_120;
  pointer local_118;
  element_type *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  __node_base local_100;
  size_type sStack_f8;
  float local_f0;
  size_t local_e8;
  mutex_type *pmStack_e0;
  small_vector<unsigned_char,_128UL> local_d8;
  
  local_661 = text;
  local_318 = "name1";
  pcStack_310 = "name2";
  local_218._M_buckets = &local_218._M_single_bucket;
  local_218._M_bucket_count = 1;
  local_218._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_218._M_element_count = 0;
  local_218._M_rehash_policy._M_max_load_factor = 1.0;
  local_218._M_rehash_policy._M_next_resize = 0;
  local_218._M_single_bucket = (__node_base_ptr)0x0;
  pdVar6 = &(this->super_GenericSection).export_db_;
  out.iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
             )0x0;
  out.container =
       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
        *)&local_218;
  add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (pdVar6,&local_318,&local_308,out);
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)&local_1e0,pdVar6);
  pstore::exchange::export_ns::ostream_base::ostream_base(&local_1a8.super_ostream_base,0x1000);
  local_1a8.str_._M_dataplus._M_p = (pointer)&local_1a8.str_.field_2;
  local_1a8.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_00243498;
  local_1a8.str_._M_string_length = 0;
  local_1a8.str_.field_2._M_local_buf[0] = '\0';
  generation = pstore::database::get_current_revision(pdVar6);
  puVar1 = local_2f8 + 0x10;
  pcVar5 = "";
  local_2f8._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"","");
  uVar8 = 0;
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)3>
            (&local_1a8.super_ostream_base,(indent)0x0,pdVar6,generation,(string *)local_2f8,
             (string_mapping *)&local_1e0,false);
  local_4e0 = pdVar6;
  if ((uchar *)local_2f8._0_8_ != puVar1) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  local_2f8._0_2_ = 0x100;
  iVar7 = 0;
  memset((small_vector<unsigned_char,_128UL> *)(local_2f8 + 8),0,0xa0);
  local_248 = (pointer)0x0;
  piStack_240 = (pointer)0x0;
  local_238 = (pointer)0x0;
  vStack_230.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_230.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_230.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8[1] = ' ';
  local_4c0 = (undefined1  [8])(local_2f8 + 8);
  local_250 = puVar1;
  do {
    local_650[0] = (internal)(char)iVar7;
    std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>::operator=
              ((back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> *)local_4c0,
               local_650);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 5);
  local_3c0[0] = data;
  local_588[0] = 3;
  local_4c0 = (undefined1  [8])&DAT_00000005;
  local_650._0_8_ = (pointer)0x7;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             &local_248,local_3c0,local_588,(unsigned_long *)local_4c0,(long *)local_650);
  local_3c0[0] = 0xb;
  local_588[0] = 0xb;
  local_4c0 = (undefined1  [8])0xd;
  local_650._0_8_ = (pointer)0x11;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             &local_248,local_3c0,local_588,(unsigned_long *)local_4c0,(long *)local_650);
  pdVar6 = local_4e0;
  local_4c0 = (undefined1  [8])local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"name1","");
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_218,(key_type *)local_4c0);
  local_158[0] = 0x13;
  local_588._0_8_ = local_588._0_8_ & 0xffffffff00000000;
  local_650._0_8_ = (pointer)0x17;
  local_3c0._0_8_ = (element_type *)0x1d;
  std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>::
  emplace_back<pstore::typed_address<pstore::indirect_string>&,unsigned_char,pstore::repo::binding,unsigned_long,long>
            ((vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>> *)
             &vStack_230,pmVar3,local_158,(binding *)local_588,(unsigned_long *)local_650,
             (long *)local_3c0);
  if (local_4c0 != (undefined1  [8])local_4b0) {
    operator_delete((void *)local_4c0,local_4b0._0_8_ + 1);
  }
  local_4c0 = (undefined1  [8])local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"name2","");
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_218,(key_type *)local_4c0);
  local_158[0] = 0x1f;
  local_588._0_4_ = 1;
  local_650._0_8_ = (pointer)0x25;
  args_2 = (section_content *)local_3c0;
  local_3c0._0_8_ = (element_type *)0x29;
  std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>::
  emplace_back<pstore::typed_address<pstore::indirect_string>&,unsigned_char,pstore::repo::binding,unsigned_long,long>
            ((vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>> *)
             &vStack_230,pmVar3,local_158,(binding *)local_588,(unsigned_long *)local_650,
             (long *)args_2);
  if (local_4c0 != (undefined1  [8])local_4b0) {
    operator_delete((void *)local_4c0,local_4b0._0_8_ + 1);
  }
  export_section<(pstore::repo::section_kind)0>
            ((string *)local_3e0,pdVar6,(string_mapping *)&local_1e0,(section_content *)local_2f8,
             false);
  local_158._24_8_ = (long)local_158 + 0x18;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ =
       (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )0x0;
  local_158._16_8_ = (pointer)0x0;
  local_158._40_8_ =
       (__uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>)0x0;
  local_158._48_8_ = local_158 + 0x30;
  local_118 = (pointer)0x0;
  local_110 = (element_type *)&pmStack_e0;
  local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_100._M_nxt = (_Hash_node_base *)0x0;
  sStack_f8 = 0;
  local_f0 = 1.0;
  local_e8 = 0;
  pmStack_e0 = (mutex_type *)0x0;
  local_4c0 = (undefined1  [8])local_660;
  local_4b8[0] = false;
  local_158._32_8_ = local_158._24_8_;
  local_120 = (_List_node_base *)local_158._48_8_;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_4c0);
  pdVar6 = &(this->super_GenericSection).import_db_;
  local_4b8[0] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_650,pdVar6,(lock_type *)local_4c0);
  if ((local_4b8[0] == true) && (local_4c0 != (undefined1  [8])0x0)) {
    local_4b8[0] = false;
  }
  local_300.ptr_ = pdVar6;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant(&local_300);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>
            ((callbacks *)local_588,local_300,
             (transaction<std::unique_lock<mock_mutex>_> *)local_650,(string_mapping *)local_158);
  local_3c0._0_8_ = local_588._0_8_;
  local_3c0._8_8_ = local_588._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_588._8_8_ + 8) = *(_Atomic_word *)(local_588._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_588._8_8_ + 8) = *(_Atomic_word *)(local_588._8_8_ + 8) + 1;
    }
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_4c0,(callbacks *)local_3c0,none
            );
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._8_8_);
  }
  src = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_1a8);
  ppVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                     ((parser<pstore::exchange::import_ns::callbacks> *)local_4c0,src);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar4);
  local_5a8[0] = local_4b0._72_4_ == 0;
  pbStack_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_4b0._72_4_ != 0) {
    testing::Message::Message((Message *)&local_678);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_678.data_._4_4_,local_678.data_._0_4_) + 0x10),
               "Expected the JSON parse to succeed (",0x24);
    (**(code **)(*(long *)local_4b0._80_8_ + 0x20))(local_3c0,local_4b0._80_8_,local_4b0._72_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_678.data_._4_4_,local_678.data_._0_4_) + 0x10),
               (char *)local_3c0._0_8_,local_3c0._8_8_);
    local_588[0] = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_678.data_._4_4_,local_678.data_._0_4_) + 0x10),local_588,1
              );
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_588,(internal *)local_5a8,(AssertionResult *)0x1df922,"true","false",
               (char *)args_2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_658,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0xb2,(char *)local_588._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._0_8_ != local_578) {
      operator_delete((void *)local_588._0_8_,local_578[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._0_8_ != local_3b0) {
      operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_678.data_._4_4_,local_678.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_678.data_._4_4_,local_678.data_._0_4_) + 8))();
    }
    if (pbStack_5a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_5a0,pbStack_5a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_p != &local_430) {
      operator_delete(local_440._M_p,local_430._M_allocated_capacity + 1);
    }
    if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)local_4b8);
    if (local_4c0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_4c0,0x68);
    }
    local_650._0_8_ = &PTR__transaction_0023bdb8;
    pstore::transaction_base::rollback((transaction_base *)local_650);
    if ((local_620 == true) && (local_628 != (_List_node_base *)0x0)) {
      local_620 = false;
    }
    goto LAB_0016c73e;
  }
  pstore::transaction_base::commit((transaction_base *)local_650);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_p != &local_430) {
    operator_delete(local_440._M_p,local_430._M_allocated_capacity + 1);
  }
  if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
            *)local_4b8);
  if (local_4c0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4c0,0x68);
  }
  local_650._0_8_ = &PTR__transaction_0023bdb8;
  pstore::transaction_base::rollback((transaction_base *)local_650);
  if ((local_620 == true) && (local_628 != (_List_node_base *)0x0)) {
    local_620 = false;
  }
  local_658 = (undefined1  [8])local_5a8;
  local_5a8 = (undefined1  [8])0x0;
  pbStack_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_598 = (pointer)0x0;
  local_4c0._0_2_ = 0x100;
  memset((small_vector<unsigned_char,_128UL> *)local_4b8,0,0xa0);
  local_410.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_410.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_410.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_3f8.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_3f8.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_3f8.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418 = (small_vector<unsigned_char,_128UL> *)local_4b0;
  (anonymous_namespace)::
  make_json_object_parser<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
            ((parser<pstore::exchange::import_ns::callbacks> *)local_3c0,
             (_anonymous_namespace_ *)pdVar6,(database *)local_158,(section_kind)local_4c0,
             (string_mapping *)local_658,args_2,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff97c,uVar8));
  uVar2 = local_3e0._0_8_;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_650,local_3e0._8_8_)
  ;
  local_650._8_8_ = uVar2;
  ppVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::
           input<pstore::gsl::span<char_const,_1l>>
                     ((parser<pstore::exchange::import_ns::callbacks> *)local_3c0,
                      (span<const_char,__1L> *)local_650);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar4);
  local_678.data_._0_4_ = CONCAT31(local_678.data_._1_3_,local_368 == 0);
  local_670 = (database *)0x0;
  if (local_368 == 0) {
    local_588._0_8_ = (long)pbStack_5a0 - (long)local_5a8 >> 3;
    local_678.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_650,"dispatchers.size ()","1U",(unsigned_long *)local_588,
               (uint *)&local_678);
    export_db = local_4e0;
    if (local_650[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_588);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_588._0_8_ + 0x10),
                 "Expected a single creation dispatcher to be added to the dispatchers container",
                 0x4e);
      if ((database *)local_650._8_8_ != (database *)0x0) {
        pcVar5 = ((_Alloc_hider *)local_650._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_678,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                 ,199,pcVar5);
      testing::internal::AssertHelper::operator=(&local_678,(Message *)local_588);
      testing::internal::AssertHelper::~AssertHelper(&local_678);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_588._0_8_ + 8))();
      }
      if ((database *)local_650._8_8_ != (database *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_650 + 8);
        pdVar6 = (database *)local_650._8_8_;
        goto LAB_0016c1db;
      }
    }
    else {
      if ((database *)local_650._8_8_ != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_650 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_650._8_8_);
      }
      testing::internal::CmpHelperEQ<pstore::repo::section_kind,pstore::repo::section_kind>
                ((internal *)local_650,"dispatchers.front ()->kind ()","kind",
                 &((((__uniq_ptr_data<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>,_true,_true>
                      *)local_5a8)->
                   super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
                   )._M_t.
                   super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
                   .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>.
                  _M_head_impl)->kind_,&local_661);
      if (local_650[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_588);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_588._0_8_ + 0x10),
                   "The creation dispatcher should be able to create a text section",0x3f);
        if ((database *)local_650._8_8_ == (database *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((_Alloc_hider *)local_650._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_678,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0xc9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_678,(Message *)local_588);
        testing::internal::AssertHelper::~AssertHelper(&local_678);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_588._0_8_ + 8))();
        }
      }
      if ((database *)local_650._8_8_ != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_650 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_650._8_8_);
      }
      testing::internal::CmpHelperEQ<pstore::repo::section_kind,pstore::repo::section_kind>
                ((internal *)local_650,"exported_content.kind","imported_content.kind",local_2f8,
                 local_4c0);
      if (local_650[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_588);
        if ((database *)local_650._8_8_ == (database *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((_Alloc_hider *)local_650._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_678,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0xcc,pcVar5);
        testing::internal::AssertHelper::operator=(&local_678,(Message *)local_588);
        testing::internal::AssertHelper::~AssertHelper(&local_678);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_588._0_8_ + 8))();
        }
      }
      if ((database *)local_650._8_8_ != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_650 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_650._8_8_);
      }
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                ((internal *)local_650,"exported_content.align","imported_content.align",
                 local_2f8 + 1,local_4c0 + 1);
      if (local_650[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_588);
        if ((database *)local_650._8_8_ == (database *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((_Alloc_hider *)local_650._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_678,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0xcd,pcVar5);
        testing::internal::AssertHelper::operator=(&local_678,(Message *)local_588);
        testing::internal::AssertHelper::~AssertHelper(&local_678);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_588._0_8_ + 8))();
        }
      }
      if ((database *)local_650._8_8_ != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_650 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_650._8_8_);
      }
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                ((small_vector<unsigned_char,_128UL> *)local_650,
                 (small_vector<unsigned_char,_128UL> *)local_4b8);
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                (&local_d8,(small_vector<unsigned_char,_128UL> *)local_650);
      if (local_5c8 != (pointer)0x0) {
        operator_delete(local_5c8,(long)local_5b8 - (long)local_5c8);
      }
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                ((small_vector<unsigned_char,_128UL> *)local_650,&local_d8);
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                ((small_vector<unsigned_char,_128UL> *)local_588,
                 (small_vector<unsigned_char,_128UL> *)local_650);
      if (local_5c8 != (pointer)0x0) {
        operator_delete(local_5c8,(long)local_5b8 - (long)local_5c8);
      }
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>>>>
      ::operator()(&local_678,local_588,
                   (small_vector<unsigned_char,_128UL> *)"exported_content.data");
      if (local_500 != (pointer)0x0) {
        operator_delete(local_500,(long)local_4f0 - (long)local_500);
      }
      if (local_d8.big_buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.big_buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.big_buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.big_buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_678.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_650);
        if (local_670 == (database *)0x0) {
          message = "";
        }
        else {
          message = ((_Alloc_hider *)&local_670->_vptr_database)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_588,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0xce,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_588,(Message *)local_650);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_588);
        if ((pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>
             *)local_650._0_8_ !=
            (pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>
             *)0x0) {
          (**(code **)(*(long *)local_650._0_8_ + 8))();
        }
      }
      if (local_670 != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_670,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670)
        ;
      }
      std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::
      vector((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_650,&local_410);
      std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::
      vector(&local_4d8,
             (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_650);
      if ((pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>
           *)local_650._0_8_ !=
          (pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>
           *)0x0) {
        operator_delete((void *)local_650._0_8_,(long)local_640.first - local_650._0_8_);
      }
      std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::
      vector((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_650,&local_4d8);
      std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::
      vector((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_588,
             (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_650);
      if ((pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>
           *)local_650._0_8_ !=
          (pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>
           *)0x0) {
        operator_delete((void *)local_650._0_8_,(long)local_640.first - local_650._0_8_);
      }
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>>
      ::operator()(&local_678,local_588,
                   (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    *)"exported_content.ifixups");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_588._0_8_,local_578[0]._M_allocated_capacity - local_588._0_8_
                       );
      }
      if (local_4d8.
          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d8.
                        super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_4d8.
                              super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4d8.
                              super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_678.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_650);
        if (local_670 == (database *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((_Alloc_hider *)&local_670->_vptr_database)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_588,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0xcf,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_588,(Message *)local_650);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_588);
        if ((pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>
             *)local_650._0_8_ !=
            (pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>
             *)0x0) {
          (**(code **)(*(long *)local_650._0_8_ + 8))();
        }
      }
      if (local_670 != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_670,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670)
        ;
      }
      compare_external_fixups<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
                (export_db,&vStack_230,pdVar6,&vStack_3f8);
    }
  }
  else {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_670;
    testing::Message::Message((Message *)local_660);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_660 + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_360 + 0x20))(local_650,local_360,local_368);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_660 + 0x10),(char *)local_650._0_8_,local_650._8_8_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_588,(internal *)&local_678,(AssertionResult *)0x1df922,"true","false"
               ,(char *)args_2);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0xc5,(char *)local_588._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._0_8_ != local_578) {
      operator_delete((void *)local_588._0_8_,local_578[0]._M_allocated_capacity + 1);
    }
    if ((pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_> *
        )local_650._0_8_ != &local_640) {
      operator_delete((void *)local_650._0_8_,(ulong)((long)local_640.first + 1));
    }
    if (local_660 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_660 + 8))();
    }
    pdVar6 = local_670;
    if (local_670 != (database *)0x0) {
LAB_0016c1db:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pdVar6);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_p != &local_330) {
    operator_delete(local_340._M_p,(ulong)(local_330._M_allocated_capacity + 1));
  }
  if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
            *)(local_3c0 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_3c0._0_8_,0x68);
  }
  if (vStack_3f8.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_3f8.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_3f8.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_3f8.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_410.
      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_410.
                    super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_410.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_410.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_430._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_430._M_allocated_capacity,(long)local_420 - local_430._0_8_);
  }
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
             *)local_5a8);
LAB_0016c73e:
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_158);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3e0 + 0x10)) {
    operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
  }
  if (vStack_230.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_230.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_230.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_230.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_248 != (pointer)0x0) {
    operator_delete(local_248,(long)local_238 - (long)local_248);
  }
  if (local_268 != (pointer)0x0) {
    operator_delete(local_268,(long)local_258 - (long)local_268);
  }
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_1a8);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1e0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_218);
  return;
}

Assistant:

TEST_F (GenericSection, RoundTripForPopulated) {
    using namespace pstore::exchange;

    constexpr auto kind = pstore::repo::section_kind::text;
    constexpr auto names_index = pstore::trailer::indices::name;
    constexpr auto comments = false;

    // The type used to store a text section's properties.
    using section_type = pstore::repo::enum_to_section_t<kind>;
    static_assert (std::is_same<section_type, pstore::repo::generic_section>::value,
                   "Expected text to map to generic_section");

    // Add names to the store so that external fixups can use then. add_export_strings()
    // yields a mapping from each name to its indirect-address.
    constexpr auto * name1 = "name1";
    constexpr auto * name2 = "name2";
    std::array<pstore::gsl::czstring, 2> names{{name1, name2}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<names_index> (export_db_, std::begin (names), std::end (names),
                                     std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<names_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                          export_db_.get_current_revision (), "", &exported_names,
                                          comments);


    pstore::repo::section_content exported_content;
    exported_content.align = 32U;
    {
        unsigned value = 0;
        std::generate_n (std::back_inserter (exported_content.data), 5U, [&value] () {
            return static_cast<decltype (exported_content.data)::value_type> (value++);
        });
    }
    exported_content.ifixups.emplace_back (pstore::repo::section_kind::data,
                                           pstore::repo::relocation_type{3},
                                           std::uint64_t{5} /*offset*/, std::int64_t{7} /*addend*/);
    exported_content.ifixups.emplace_back (
        pstore::repo::section_kind::read_only, pstore::repo::relocation_type{11},
        std::uint64_t{13} /*offset*/, std::int64_t{17} /*addend*/);
    exported_content.xfixups.emplace_back (
        indir_strings[name1], pstore::repo::relocation_type{19}, pstore::repo::binding::strong,
        std::uint64_t{23} /*offset*/, std::int64_t{29} /*addend*/);
    exported_content.xfixups.emplace_back (
        indir_strings[name2], pstore::repo::relocation_type{31}, pstore::repo::binding::weak,
        std::uint64_t{37} /*offset*/, std::int64_t{41} /*addend*/);


    std::string const exported_json =
        export_section<kind> (export_db_, exported_names, exported_content, comments);



    // Parse the exported names JSON. The resulting index-to-string mappings are then available via
    // imported_names.
    import_ns::string_mapping imported_names;
    {
        // Create matching names in the imported database.
        mock_mutex mutex;
        using transaction_lock = std::unique_lock<mock_mutex>;
        auto transaction = begin (import_db_, transaction_lock{mutex});

        auto parser = pstore::json::make_parser (
            import_ns::callbacks::make<
                import_ns::array_rule<import_ns::strings_array_members, decltype (&transaction),
                                      decltype (&imported_names)>> (&import_db_, &transaction,
                                                                    &imported_names));
        parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (parser.has_error ())
            << "Expected the JSON parse to succeed (" << parser.last_error ().message () << ')';

        transaction.commit ();
    }

    // Now set up the import. We'll build two objects: an instance of a section-creation-dispatcher
    // which knows how to build a text section and a section-content which will describe the
    // contents of that new section.
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);

    pstore::repo::section_content imported_content;

    // Find the rule that is used to import sections represented by an instance of section_type.
    using section_importer = import_ns::section_to_importer_t<section_type, decltype (inserter)>;
    auto parser = make_json_object_parser<section_importer> (&import_db_, kind, &imported_names,
                                                             &imported_content, &inserter);
    parser.input (exported_json).eof ();
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();

    ASSERT_EQ (dispatchers.size (), 1U)
        << "Expected a single creation dispatcher to be added to the dispatchers container";
    EXPECT_EQ (dispatchers.front ()->kind (), kind)
        << "The creation dispatcher should be able to create a text section";

    EXPECT_EQ (exported_content.kind, imported_content.kind);
    EXPECT_EQ (exported_content.align, imported_content.align);
    EXPECT_THAT (exported_content.data, testing::ContainerEq (imported_content.data));
    EXPECT_THAT (exported_content.ifixups, testing::ContainerEq (imported_content.ifixups));
    compare_external_fixups (export_db_, exported_content.xfixups, import_db_,
                             imported_content.xfixups);
}